

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Encode
          (Minefield_Response_NACK_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Minefield_Response_NACK_PDU *this_local;
  
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_ReqID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ReqID);
  KDataStream::operator<<(pKVar2,this->m_ui8NumMisPdus);
  citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vSeqNums);
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_vSeqNums);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    KDataStream::operator<<(stream,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Minefield_Response_NACK_PDU::Encode( KDataStream & stream ) const
{
    Minefield_Header::Encode( stream );

    stream << KDIS_STREAM m_ReqID
           << m_ui8ReqID
           << m_ui8NumMisPdus;

    vector<KUINT8>::const_iterator citr = m_vSeqNums.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vSeqNums.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}